

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL>::SmallVector
          (void *param_1)

{
  size_type in_stack_ffffffffffffffd8;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_ffffffffffffffe0
  ;
  
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::SmallVectorBase
            ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)param_1,8);
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::reserve
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }